

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolyJsonFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  GeoPoly *pGVar1;
  sqlite3_context *pCtx;
  int *in_RDX;
  undefined4 in_ESI;
  sqlite3_context *in_RDI;
  int i;
  sqlite3_str *x;
  sqlite3 *db;
  GeoPoly *p;
  _func_void_void_ptr *in_stack_ffffffffffffffb8;
  sqlite3_str *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  sqlite3 *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  pGVar1 = geopolyFuncParam(in_RDI,(sqlite3_value *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                            in_RDX);
  if (pGVar1 != (GeoPoly *)0x0) {
    sqlite3_context_db_handle(in_RDI);
    pCtx = (sqlite3_context *)sqlite3_str_new(in_stack_ffffffffffffffd0);
    sqlite3_str_append(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,0);
    for (iVar2 = 0; iVar2 < pGVar1->nVertex; iVar2 = iVar2 + 1) {
      sqlite3_str_appendf((StrAccum *)(double)pGVar1->a[iVar2 << 1],
                          (char *)(double)pGVar1->a[iVar2 * 2 + 1],pCtx,"[%!g,%!g],");
    }
    sqlite3_str_appendf((StrAccum *)(double)pGVar1->a[0],(char *)(double)pGVar1->a[1],pCtx,
                        "[%!g,%!g]]");
    sqlite3_str_finish((sqlite3_str *)in_RDI);
    sqlite3_result_text(pCtx,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                        (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8);
    sqlite3_free((void *)0x29fcc7);
  }
  return;
}

Assistant:

static void geopolyJsonFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyFuncParam(context, argv[0], 0);
  (void)argc;
  if( p ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    sqlite3_str *x = sqlite3_str_new(db);
    int i;
    sqlite3_str_append(x, "[", 1);
    for(i=0; i<p->nVertex; i++){
      sqlite3_str_appendf(x, "[%!g,%!g],", GeoX(p,i), GeoY(p,i));
    }
    sqlite3_str_appendf(x, "[%!g,%!g]]", GeoX(p,0), GeoY(p,0));
    sqlite3_result_text(context, sqlite3_str_finish(x), -1, sqlite3_free);
    sqlite3_free(p);
  }
}